

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar_p.h
# Opt level: O2

void __thiscall QTabBarPrivate::Tab::~Tab(Tab *this)

{
  std::
  unique_ptr<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
  ::~unique_ptr(&this->animation);
  ::QVariant::~QVariant(&this->data);
  QIcon::~QIcon(&this->icon);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->accessibleName).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->whatsThis).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->toolTip).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this);
  return;
}

Assistant:

inline Tab(const QIcon &ico, const QString &txt)
        : text(txt), icon(ico), enabled(true), visible(true), measuringMinimum(false)
        {
        }